

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  Type *pTVar1;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  RepeatedPtrFieldBase *in_RDI;
  int i;
  undefined4 local_e8;
  int in_stack_ffffffffffffff8c;
  RepeatedPtrFieldBase *in_stack_ffffffffffffff90;
  
  if (0 < in_EDX) {
    if (in_RCX != 0) {
      for (local_e8 = 0; local_e8 < in_EDX; local_e8 = local_e8 + 1) {
        pTVar1 = internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        *(Type **)(in_RCX + (long)local_e8 * 8) = pTVar1;
      }
    }
    internal::RepeatedPtrFieldBase::CloseGap(in_RDI,in_ESI,in_EDX);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != NULL) {
      for (int i = 0; i < num; ++i) {
        elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
      }
    }
    CloseGap(start, num);
  }
}